

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_setmetatable(lua_State *L,int objindex)

{
  uint uVar1;
  TValue *pTVar2;
  Table *local_28;
  Table *mt;
  TValue *obj;
  int objindex_local;
  lua_State *L_local;
  
  pTVar2 = index2addr(L,objindex);
  if (L->top[-1].tt_ == 0) {
    local_28 = (Table *)0x0;
  }
  else {
    local_28 = (Table *)L->top[-1].value_.gc;
  }
  uVar1 = pTVar2->tt_ & 0xf;
  if (uVar1 == 5) {
    *(Table **)((pTVar2->value_).f + 0x28) = local_28;
    if (local_28 != (Table *)0x0) {
      if (((((pTVar2->value_).gc)->marked & 4) != 0) && ((local_28->marked & 3) != 0)) {
        luaC_barrier_(L,(pTVar2->value_).gc,(GCObject *)local_28);
      }
      luaC_checkfinalizer(L,(pTVar2->value_).gc,local_28);
    }
  }
  else if (uVar1 == 7) {
    *(Table **)((pTVar2->value_).f + 0x10) = local_28;
    if (local_28 != (Table *)0x0) {
      if (((((pTVar2->value_).gc)->marked & 4) != 0) && ((local_28->marked & 3) != 0)) {
        luaC_barrier_(L,(pTVar2->value_).gc,(GCObject *)local_28);
      }
      luaC_checkfinalizer(L,(pTVar2->value_).gc,local_28);
    }
  }
  else {
    L->l_G->mt[(int)(pTVar2->tt_ & 0xf)] = local_28;
  }
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable (lua_State *L, int objindex) {
  TValue *obj;
  Table *mt;
  lua_lock(L);
  api_checknelems(L, 1);
  obj = index2addr(L, objindex);
  if (ttisnil(L->top - 1))
    mt = NULL;
  else {
    api_check(L, ttistable(L->top - 1), "table expected");
    mt = hvalue(L->top - 1);
  }
  switch (ttnov(obj)) {
    case LUA_TTABLE: {
      hvalue(obj)->metatable = mt;
      if (mt) {
        luaC_objbarrier(L, gcvalue(obj), mt);
        luaC_checkfinalizer(L, gcvalue(obj), mt);
      }
      break;
    }
    case LUA_TUSERDATA: {
      uvalue(obj)->metatable = mt;
      if (mt) {
        luaC_objbarrier(L, uvalue(obj), mt);
        luaC_checkfinalizer(L, gcvalue(obj), mt);
      }
      break;
    }
    default: {
      G(L)->mt[ttnov(obj)] = mt;
      break;
    }
  }
  L->top--;
  lua_unlock(L);
  return 1;
}